

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgsStreamReader.cpp
# Opt level: O0

void __thiscall PGSStreamReader::intDecodeStream(PGSStreamReader *this,uint8_t *buffer,size_t len)

{
  byte bVar1;
  PESPacket *end;
  undefined1 local_60 [8];
  BitStreamReader bitReader;
  uint16_t segment_len;
  uint8_t segment_type;
  PESPacket *pesPacket;
  uint8_t *curPos;
  uint8_t *bufEnd;
  size_t len_local;
  uint8_t *buffer_local;
  PGSStreamReader *this_local;
  
  end = (PESPacket *)(buffer + len);
  pesPacket = (PESPacket *)buffer;
  while( true ) {
    if (end <= pesPacket) {
      return;
    }
    if ((long)end - (long)pesPacket < 10) {
      return;
    }
    if ((pesPacket->startCode0 == 'P') && (pesPacket->startCode1 == 'G')) {
      pesPacket = (PESPacket *)&pesPacket[1].startCode1;
    }
    else if ((pesPacket->startCode0 == '\0') &&
            ((pesPacket->startCode1 == '\0' && (pesPacket->startCode2 == '\x01')))) {
      bVar1 = PESPacket::getHeaderLength(pesPacket);
      pesPacket = (PESPacket *)(&pesPacket->startCode0 + (int)(uint)bVar1);
      if (end <= pesPacket) {
        return;
      }
    }
    bitReader.m_bitLeft._3_1_ = pesPacket->startCode0;
    bitReader.m_bitLeft._0_2_ = AV_RB16(&pesPacket->startCode1);
    if ((long)end - (long)pesPacket < (long)((ulong)(uint16_t)bitReader.m_bitLeft + 3)) break;
    if (bitReader.m_bitLeft._3_1_ == '\x16') {
      BitStreamReader::BitStreamReader((BitStreamReader *)local_60);
      BitStreamReader::setBuffer((BitStreamReader *)local_60,&pesPacket->m_streamID,(uint8_t *)end);
      video_descriptor(this,(BitStreamReader *)local_60);
      return;
    }
    pesPacket = (PESPacket *)(&pesPacket->m_streamID + (int)(uint)(uint16_t)bitReader.m_bitLeft);
  }
  return;
}

Assistant:

void PGSStreamReader::intDecodeStream(uint8_t* buffer, const size_t len)
{
    const uint8_t* bufEnd = buffer + len;
    uint8_t* curPos = buffer;
    while (curPos < bufEnd)
    {
        if (bufEnd - curPos < 10)
            return;
        if (curPos[0] == 'P' && curPos[1] == 'G')
            curPos += 10;
        else if (curPos[0] == 0 && curPos[1] == 0 && curPos[2] == 1)
        {
            const auto pesPacket = reinterpret_cast<PESPacket*>(curPos);
            curPos += pesPacket->getHeaderLength();
            if (curPos >= bufEnd)
                return;
        }

        const uint8_t segment_type = *curPos;
        const auto segment_len = AV_RB16(curPos + 1);
        if (bufEnd - curPos < 3ll + segment_len)
            return;

        curPos += 3;
        if (segment_type == 0x16)
        {
            BitStreamReader bitReader{};
            bitReader.setBuffer(curPos, bufEnd);
            video_descriptor(bitReader);
            return;
        }
        curPos += segment_len;
    }
}